

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void setup_room(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  object_t oVar3;
  uint uVar4;
  uint uVar5;
  uint8_t uVar6;
  char cVar7;
  tgestate_t *in_RDI;
  uint8_t row;
  uint8_t column;
  uint8_t object_index;
  uint8_t index;
  uint c;
  uint8_t *p;
  uint8_t iters;
  uint8_t count;
  mask_t *pmask;
  bounds_t *pbounds;
  int offset;
  int room_index;
  uint local_34;
  bounds_t *in_stack_ffffffffffffffd0;
  room_t room_index_00;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  uint8_t uVar8;
  char cVar9;
  undefined1 in_stack_ffffffffffffffdf;
  mask_t *local_20;
  
  wipe_visible_tiles((tgestate_t *)0x1065d3);
  setup_doors(in_RDI);
  iVar2 = get_roomdef((tgestate_t *)
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                      (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                      (int)in_stack_ffffffffffffffd0);
  in_RDI->roomdef_dimensions_index = (uint8_t)iVar2;
  iVar2 = get_roomdef((tgestate_t *)
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                      (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                      (int)in_stack_ffffffffffffffd0);
  bVar1 = (byte)iVar2;
  in_RDI->roomdef_object_bounds_count = bVar1;
  if (bVar1 != 0) {
    in_stack_ffffffffffffffd0 = in_RDI->roomdef_object_bounds;
    for (local_34 = 0; local_34 < (uint)bVar1 << 2; local_34 = local_34 + 1) {
      iVar2 = get_roomdef((tgestate_t *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffde,
                                                  in_stack_ffffffffffffffd8)),
                          (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                          (int)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0->x0 = (uint8_t)iVar2;
      in_stack_ffffffffffffffd0 = (bounds_t *)&in_stack_ffffffffffffffd0->x1;
    }
  }
  iVar2 = get_roomdef((tgestate_t *)
                      CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                      (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                      (int)in_stack_ffffffffffffffd0);
  in_RDI->interior_mask_data_count = (uint8_t)iVar2;
  local_20 = in_RDI->interior_mask_data;
  uVar8 = (uint8_t)iVar2;
  while( true ) {
    uVar6 = uVar8 + 0xff;
    room_index_00 = (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
    if (uVar8 == '\0') break;
    iVar2 = get_roomdef((tgestate_t *)CONCAT17(bVar1,CONCAT16(uVar6,in_stack_ffffffffffffffd8)),
                        room_index_00,(int)in_stack_ffffffffffffffd0);
    *local_20 = setup_room::interior_mask_data_source[(byte)iVar2];
    local_20 = local_20 + 1;
    uVar8 = uVar6;
  }
  iVar2 = get_roomdef((tgestate_t *)CONCAT17(bVar1,CONCAT16(uVar6,in_stack_ffffffffffffffd8)),
                      room_index_00,(int)in_stack_ffffffffffffffd0);
  cVar9 = (char)iVar2;
  while (cVar7 = cVar9 + -1, cVar9 != '\0') {
    oVar3 = get_roomdef((tgestate_t *)CONCAT17(bVar1,CONCAT16(cVar7,in_stack_ffffffffffffffd8)),
                        (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                        (int)in_stack_ffffffffffffffd0);
    uVar4 = get_roomdef((tgestate_t *)CONCAT17(bVar1,CONCAT16(cVar7,in_stack_ffffffffffffffd8)),
                        (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                        (int)in_stack_ffffffffffffffd0);
    uVar5 = get_roomdef((tgestate_t *)CONCAT17(bVar1,CONCAT16(cVar7,in_stack_ffffffffffffffd8)),
                        (room_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                        (int)in_stack_ffffffffffffffd0);
    expand_object(in_RDI,oVar3 & 0xff,
                  in_RDI->tile_buf + (int)((uVar5 & 0xff) * in_RDI->columns + (uVar4 & 0xff)));
    cVar9 = cVar7;
  }
  return;
}

Assistant:

void setup_room(tgestate_t *state)
{
  /**
   * $EA7C: Interior masking data.
   *
   * Conv: Constant final (pos.height) byte added into this data.
   */
  static const mask_t interior_mask_data_source[47] =
  {
    { 27, { 123, 127, 241, 243 }, { 54, 40, 32 } },
    { 27, { 119, 123, 243, 245 }, { 54, 24, 32 } },
    { 27, { 124, 128, 241, 243 }, { 50, 42, 32 } },
    { 25, { 131, 134, 242, 247 }, { 24, 36, 32 } },
    { 25, { 129, 132, 244, 249 }, { 24, 26, 32 } },
    { 25, { 129, 132, 243, 248 }, { 28, 23, 32 } },
    { 25, { 131, 134, 244, 248 }, { 22, 32, 32 } },
    { 24, { 125, 128, 244, 249 }, { 24, 26, 32 } },
    { 24, { 123, 126, 243, 248 }, { 34, 26, 32 } },
    { 24, { 121, 124, 244, 249 }, { 34, 16, 32 } },
    { 24, { 123, 126, 244, 249 }, { 28, 23, 32 } },
    { 24, { 121, 124, 241, 246 }, { 44, 30, 32 } },
    { 24, { 125, 128, 242, 247 }, { 36, 34, 32 } },
    { 29, { 127, 130, 246, 247 }, { 28, 30, 32 } },
    { 29, { 130, 133, 242, 243 }, { 35, 48, 32 } },
    { 29, { 134, 137, 242, 243 }, { 28, 55, 32 } },
    { 29, { 134, 137, 244, 245 }, { 24, 48, 32 } },
    { 29, { 128, 131, 241, 242 }, { 40, 48, 32 } },
    { 28, { 129, 130, 244, 246 }, { 28, 32, 32 } },
    { 28, { 131, 132, 244, 246 }, { 28, 46, 32 } },
    { 26, { 126, 128, 245, 247 }, { 28, 32, 32 } },
    { 18, { 122, 123, 242, 243 }, { 58, 40, 32 } },
    { 18, { 122, 123, 239, 240 }, { 69, 53, 32 } },
    { 23, { 128, 133, 244, 246 }, { 28, 36, 32 } },
    { 20, { 128, 132, 243, 245 }, { 38, 40, 32 } },
    { 21, { 132, 133, 246, 247 }, { 26, 30, 32 } },
    { 21, { 126, 127, 243, 244 }, { 46, 38, 32 } },
    { 22, { 124, 133, 239, 243 }, { 50, 34, 32 } },
    { 22, { 121, 130, 240, 244 }, { 52, 26, 32 } },
    { 22, { 125, 134, 242, 246 }, { 36, 26, 32 } },
    { 16, { 118, 120, 245, 247 }, { 54, 10, 32 } },
    { 16, { 122, 124, 243, 245 }, { 54, 10, 32 } },
    { 16, { 126, 128, 241, 243 }, { 54, 10, 32 } },
    { 16, { 130, 132, 239, 241 }, { 54, 10, 32 } },
    { 16, { 134, 136, 237, 239 }, { 54, 10, 32 } },
    { 16, { 138, 140, 235, 237 }, { 54, 10, 32 } },
    { 17, { 115, 117, 235, 237 }, { 10, 48, 32 } },
    { 17, { 119, 121, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 239, 241 }, { 10, 48, 32 } },
    { 17, { 127, 129, 241, 243 }, { 10, 48, 32 } },
    { 17, { 131, 133, 243, 245 }, { 10, 48, 32 } },
    { 17, { 135, 137, 245, 247 }, { 10, 48, 32 } },
    { 16, { 132, 134, 244, 246 }, { 10, 48, 32 } }, /* BUG FIX: bound.y1 was 1 too high. */
    { 17, { 135, 137, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 243, 245 }, { 10, 10, 32 } },
    { 17, { 121, 123, 244, 246 }, { 10, 10, 32 } },
    { 15, { 136, 140, 245, 248 }, { 10, 10, 32 } },
  };

  /* Conv: Direct access to the room definition data has been removed and
   * replaced with calls to get_room_byte. */

  //const roomdef_t *proomdef; /* was HL */
  int              room_index;  /* Conv: Replaces direct access */
  int              offset;      /* Conv: Replaces direct access */
  bounds_t        *pbounds;  /* was DE */
  mask_t          *pmask;    /* was DE */
  uint8_t          count;    /* was A */
  uint8_t          iters;    /* was B */

  assert(state != NULL);

  wipe_visible_tiles(state);

  assert(state->room_index < room__LIMIT);
  room_index = state->room_index; /* local cached copy */
  offset     = 0;

  setup_doors(state);

  state->roomdef_dimensions_index = get_roomdef(state, room_index, offset++);

  /* Copy boundaries into state. */
  state->roomdef_object_bounds_count = count = get_roomdef(state, room_index, offset); /* count of boundaries */
  assert(count <= MAX_ROOMDEF_OBJECT_BOUNDS);
  pbounds = &state->roomdef_object_bounds[0]; /* Conv: Moved */
  if (count == 0) /* no boundaries */
  {
    offset++; /* skip to interior mask */
  }
  else
  {
    uint8_t     *p; /* so we can access bounds as bytes */
    unsigned int c; /* */

    offset++; /* Conv: Don't re-copy already copied count byte. */
    p = &pbounds->x0;
    for (c = 0; c < count * sizeof(bounds_t); c++)
      *p++ = get_roomdef(state, room_index, offset++);
    /* arrive at interior mask */
  }

  /* Copy interior mask into state->interior_mask_data. */
  state->interior_mask_data_count = iters = get_roomdef(state, room_index, offset++); /* count of interior masks */
  assert(iters <= MAX_INTERIOR_MASK_REFS);
  pmask = &state->interior_mask_data[0]; /* Conv: Moved */
  while (iters--)
  {
    uint8_t index;

    index = get_roomdef(state, room_index, offset++);
    /* Conv: Structures were changed from 7 to 8 bytes wide. */
    memcpy(pmask, &interior_mask_data_source[index], sizeof(*pmask));
    pmask++;
  }

  /* Plot all objects (as tiles). */
  iters = get_roomdef(state, room_index, offset++); /* Count of objects */
  while (iters--)
  {
    uint8_t object_index;
    uint8_t column;
    uint8_t row;

    object_index = get_roomdef(state, room_index, offset++);
    column       = get_roomdef(state, room_index, offset++);
    row          = get_roomdef(state, room_index, offset++);

    expand_object(state, object_index, &state->tile_buf[row * state->columns + column]);
  }
}